

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

double __thiscall flexbuffers::Reference::AsDouble(Reference *this)

{
  uint8_t *puVar1;
  int64_t iVar2;
  char *s;
  size_t sVar3;
  uint64_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Sized local_50;
  String local_38;
  Reference *local_20;
  double d;
  Reference *this_local;
  
  d = (double)this;
  if (this->type_ == FBT_FLOAT) {
    this_local = (Reference *)ReadDouble(this->data_,this->parent_width_);
  }
  else {
    switch(this->type_) {
    case FBT_NULL:
      this_local = (Reference *)0x0;
      break;
    case FBT_INT:
      iVar2 = ReadInt64(this->data_,this->parent_width_);
      this_local = (Reference *)(double)iVar2;
      break;
    case FBT_UINT:
      uVar4 = ReadUInt64(this->data_,this->parent_width_);
      auVar5._8_4_ = (int)(uVar4 >> 0x20);
      auVar5._0_8_ = uVar4;
      auVar5._12_4_ = 0x45300000;
      this_local = (Reference *)
                   ((auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
      break;
    default:
      this_local = (Reference *)0x0;
      break;
    case FBT_STRING:
      AsString(&local_38,this);
      s = String::c_str(&local_38);
      flatbuffers::StringToNumber<double>(s,(double *)&local_20);
      this_local = local_20;
      break;
    case FBT_INDIRECT_INT:
      puVar1 = Indirect(this);
      iVar2 = ReadInt64(puVar1,this->byte_width_);
      this_local = (Reference *)(double)iVar2;
      break;
    case FBT_INDIRECT_UINT:
      puVar1 = Indirect(this);
      uVar4 = ReadUInt64(puVar1,this->byte_width_);
      auVar6._8_4_ = (int)(uVar4 >> 0x20);
      auVar6._0_8_ = uVar4;
      auVar6._12_4_ = 0x45300000;
      this_local = (Reference *)
                   ((auVar6._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
      break;
    case FBT_INDIRECT_FLOAT:
      puVar1 = Indirect(this);
      this_local = (Reference *)ReadDouble(puVar1,this->byte_width_);
      break;
    case FBT_VECTOR:
      AsVector((Vector *)&local_50,this);
      sVar3 = Sized::size(&local_50);
      auVar7._8_4_ = (int)(sVar3 >> 0x20);
      auVar7._0_8_ = sVar3;
      auVar7._12_4_ = 0x45300000;
      this_local = (Reference *)
                   ((auVar7._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
      break;
    case FBT_BOOL:
      uVar4 = ReadUInt64(this->data_,this->parent_width_);
      auVar8._8_4_ = (int)(uVar4 >> 0x20);
      auVar8._0_8_ = uVar4;
      auVar8._12_4_ = 0x45300000;
      this_local = (Reference *)
                   ((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
    }
  }
  return (double)this_local;
}

Assistant:

double AsDouble() const {
    if (type_ == FBT_FLOAT) {
      // A fast path for the common case.
      return ReadDouble(data_, parent_width_);
    } else
      switch (type_) {
        case FBT_INDIRECT_FLOAT: return ReadDouble(Indirect(), byte_width_);
        case FBT_INT:
          return static_cast<double>(ReadInt64(data_, parent_width_));
        case FBT_UINT:
          return static_cast<double>(ReadUInt64(data_, parent_width_));
        case FBT_INDIRECT_INT:
          return static_cast<double>(ReadInt64(Indirect(), byte_width_));
        case FBT_INDIRECT_UINT:
          return static_cast<double>(ReadUInt64(Indirect(), byte_width_));
        case FBT_NULL: return 0.0;
        case FBT_STRING: {
          double d;
          flatbuffers::StringToNumber(AsString().c_str(), &d);
          return d;
        }
        case FBT_VECTOR: return static_cast<double>(AsVector().size());
        case FBT_BOOL:
          return static_cast<double>(ReadUInt64(data_, parent_width_));
        default:
          // Convert strings and other things to float.
          return 0;
      }
  }